

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_t _elemsize;
  size_t sVar7;
  size_t sVar8;
  Layer *pLVar9;
  ulong uVar10;
  int *piVar11;
  int iVar12;
  void *pvVar13;
  ulong uVar14;
  void *pvVar15;
  undefined4 *puVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint _w;
  long lVar21;
  undefined4 *puVar22;
  long lVar23;
  int iVar24;
  undefined4 *puVar25;
  ulong uVar26;
  uint _h;
  Option opt_g;
  int local_1c8;
  long local_180;
  long local_178;
  Mat local_158;
  Mat local_108;
  long local_c0;
  long local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  undefined4 local_78;
  int iStack_74;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  iVar3 = (this->super_Convolution).kernel_w;
  iVar4 = (this->super_Convolution).stride_w;
  uVar5 = (this->super_Convolution).dilation_w;
  uVar17 = (ulong)uVar5;
  iVar20 = (iVar3 + -1) * uVar5 + 1;
  iVar12 = (iVar1 - iVar20) / iVar4;
  iVar19 = iVar12 + 1;
  Mat::create(top_blob,iVar19,(iVar2 - iVar20) / iVar4 + 1,(this->super_Convolution).num_output,
              _elemsize,opt->blob_allocator);
  local_1c8 = -100;
  if ((top_blob->data != (void *)0x0) &&
     (local_1c8 = -100, (long)top_blob->c * top_blob->cstep != 0)) {
    local_108.cstep = 0;
    local_108.data = (void *)0x0;
    local_108.refcount._0_4_ = 0;
    local_108.refcount._4_4_ = 0;
    local_108.elemsize._0_4_ = 0;
    local_108.elemsize._4_4_ = 0;
    local_108.elempack = 0;
    local_108.allocator = (Allocator *)0x0;
    local_108.dims = 0;
    local_108.w = 0;
    local_108.h = 0;
    local_108.d = 0;
    local_108.c = 0;
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    if (0 < (int)uVar5) {
      local_b8 = (long)iVar1 << 2;
      local_c0 = (long)iVar12 * 4 + 4;
      local_80 = (long)(int)(iVar19 * uVar5) << 2;
      local_180 = 0;
      local_178 = 0;
      uVar14 = 0;
      do {
        uVar10 = (long)(int)((uVar5 + iVar2 + -1) - (int)uVar14) / (long)(int)uVar5;
        iVar12 = (int)uVar10;
        uVar18 = (long)(iVar12 - iVar3) / (long)iVar4;
        local_90 = uVar18 & 0xffffffff;
        _h = (int)uVar18 + 1;
        uVar18 = 0;
        local_b0 = uVar14;
        local_a8 = local_178;
        local_a0 = local_180;
        do {
          uVar14 = (long)(int)((uVar5 + iVar1 + -1) - (int)uVar18) / (long)(int)uVar5;
          iVar20 = (int)uVar14;
          iVar19 = (iVar20 - iVar3) / iVar4;
          local_98 = uVar18;
          Mat::create(&local_108,iVar20,iVar12,bottom_blob->c,_elemsize,opt->workspace_allocator);
          local_1c8 = -100;
          if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_108.cstep == 0))
          goto LAB_0016537e;
          _w = iVar19 + 1;
          Mat::create(&local_158,_w,_h,(this->super_Convolution).num_output,_elemsize,
                      opt->workspace_allocator);
          if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0))
          goto LAB_0016537e;
          iVar6 = bottom_blob->c;
          if (0 < (long)iVar6) {
            lVar21 = (long)bottom_blob->data + local_178;
            local_88 = bottom_blob->cstep * bottom_blob->elemsize;
            lVar23 = 0;
            pvVar13 = local_108.data;
            do {
              if (0 < iVar12) {
                iVar24 = 0;
                uVar18 = 0;
                pvVar15 = pvVar13;
                do {
                  if (0 < iVar20) {
                    puVar16 = (undefined4 *)(lVar21 + (long)iVar24 * 4);
                    uVar26 = 0;
                    do {
                      *(undefined4 *)((long)pvVar15 + uVar26 * 4) = *puVar16;
                      uVar26 = uVar26 + 1;
                      puVar16 = puVar16 + uVar17;
                    } while ((uVar14 & 0xffffffff) != uVar26);
                  }
                  uVar18 = uVar18 + 1;
                  iVar24 = iVar24 + uVar5 * iVar1;
                  pvVar15 = (void *)((long)pvVar15 + (long)iVar20 * 4);
                } while (uVar18 != (uVar10 & 0xffffffff));
              }
              lVar23 = lVar23 + 1;
              lVar21 = lVar21 + local_88;
              pvVar13 = (void *)((long)pvVar13 +
                                local_108.cstep *
                                CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
            } while (lVar23 != iVar6);
          }
          local_78._0_1_ = opt->lightmode;
          local_78._1_1_ = opt->use_shader_pack8;
          local_78._2_1_ = opt->use_subgroup_ops;
          local_78._3_1_ = opt->use_reserved_0;
          iStack_74 = opt->num_threads;
          local_68 = *(undefined4 *)&opt->workspace_allocator;
          uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
          iStack_60 = opt->openmp_blocktime;
          uStack_5c._0_1_ = opt->use_winograd_convolution;
          uStack_5c._1_1_ = opt->use_sgemm_convolution;
          uStack_5c._2_1_ = opt->use_int8_inference;
          uStack_5c._3_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          uStack_54._0_1_ = opt->use_int8_packed;
          uStack_54._1_1_ = opt->use_int8_storage;
          uStack_54._2_1_ = opt->use_int8_arithmetic;
          uStack_54._3_1_ = opt->use_packing_layout;
          iStack_50 = opt->vulkan_device_index;
          uStack_4c._0_1_ = opt->use_reserved_1;
          uStack_4c._1_1_ = opt->use_image_storage;
          uStack_4c._2_1_ = opt->use_tensor_storage;
          uStack_4c._3_1_ = opt->use_reserved_2;
          local_48 = opt->flush_denormals;
          uStack_44._0_1_ = opt->use_local_pool_allocator;
          uStack_44._1_1_ = opt->use_shader_local_memory;
          uStack_44._2_1_ = opt->use_cooperative_matrix;
          uStack_44._3_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_fp16_uniform;
          uStack_3c._0_1_ = opt->use_int8_uniform;
          uStack_3c._1_1_ = opt->use_reserved_9;
          uStack_3c._2_1_ = opt->use_reserved_10;
          uStack_3c._3_1_ = opt->use_reserved_11;
          pAStack_70 = local_158.allocator;
          (*this->convolution_dilation1->_vptr_Layer[7])
                    (this->convolution_dilation1,&local_108,&local_158,&local_78);
          lVar21 = (long)(this->super_Convolution).num_output;
          if (0 < lVar21) {
            sVar7 = top_blob->cstep;
            puVar16 = (undefined4 *)((long)top_blob->data + local_180);
            sVar8 = top_blob->elemsize;
            lVar23 = 0;
            pvVar13 = local_158.data;
            do {
              if (-1 < (int)local_90) {
                uVar14 = 0;
                puVar22 = puVar16;
                pvVar15 = pvVar13;
                do {
                  if (-1 < iVar19) {
                    uVar18 = 0;
                    puVar25 = puVar22;
                    do {
                      *puVar25 = *(undefined4 *)((long)pvVar15 + uVar18 * 4);
                      uVar18 = uVar18 + 1;
                      puVar25 = puVar25 + uVar17;
                    } while (_w != uVar18);
                  }
                  uVar14 = uVar14 + 1;
                  puVar22 = (undefined4 *)((long)puVar22 + local_80);
                  pvVar15 = (void *)((long)pvVar15 + (long)(int)_w * 4);
                } while (uVar14 != _h);
              }
              lVar23 = lVar23 + 1;
              puVar16 = (undefined4 *)((long)puVar16 + sVar7 * sVar8);
              pvVar13 = (void *)((long)pvVar13 +
                                local_158.cstep *
                                CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
            } while (lVar23 != lVar21);
          }
          uVar18 = local_98 + 1;
          local_178 = local_178 + 4;
          local_180 = local_180 + 4;
        } while (uVar18 != uVar17);
        uVar14 = local_b0 + 1;
        local_178 = local_a8 + local_b8;
        local_180 = local_a0 + local_c0;
      } while (uVar14 != uVar17);
    }
    pLVar9 = this->activation;
    if (pLVar9 == (Layer *)0x0) {
      local_1c8 = 0;
    }
    else {
      (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
      local_1c8 = 0;
    }
LAB_0016537e:
    piVar11 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar11 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return local_1c8;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}